

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O1

void protodec_getdata(int bufferlen,demod_state_t *d)

{
  byte bVar1;
  unsigned_long tmp;
  uint uVar2;
  ulong received_t_00;
  int fillbits;
  long lVar3;
  time_t received_t;
  time_t local_20;
  
  lVar3 = -6;
  bVar1 = 5;
  uVar2 = 0;
  do {
    uVar2 = uVar2 | (uint)d->rbuffer[lVar3 + 6] << (bVar1 & 0x1f);
    bVar1 = bVar1 - 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  if (0xffffffe4 < (uVar2 & 0xff) - 0x1c) {
    time(&local_20);
    lVar3 = (long)bufferlen;
    uVar2 = bufferlen % 6;
    received_t_00 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      fillbits = 0;
    }
    else {
      fillbits = 6 - uVar2;
      bufferlen = bufferlen + fillbits;
      received_t_00 = (ulong)bufferlen;
      do {
        d->rbuffer[lVar3] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 < (long)received_t_00);
    }
    protodec_generate_nmea(d,bufferlen,fillbits,received_t_00);
    bVar1 = d->seqnr + 1;
    if (9 < bVar1) {
      bVar1 = 0;
    }
    d->seqnr = bVar1;
  }
  return;
}

Assistant:

void protodec_getdata(int bufferlen, struct demod_state_t *d)
{
	unsigned char type = protodec_henten(0, 6, d->rbuffer);
	if (type < 1 || type > MAX_AIS_PACKET_TYPE /* 9 */)
		return;
//	unsigned long mmsi = protodec_henten(8, 30, d->rbuffer);
	int fillbits = 0;
	int k;
	time_t received_t;
	time(&received_t);
	
	if (bufferlen % 6 > 0) {
		fillbits = 6 - (bufferlen % 6);
		for (k = bufferlen; k < bufferlen + fillbits; k++)
			d->rbuffer[k] = 0;
		
		bufferlen = bufferlen + fillbits;
	}

	protodec_generate_nmea(d, bufferlen, fillbits, received_t);
	
	d->seqnr++;
	if (d->seqnr > 9)
		d->seqnr = 0;
	
	if (type < 1 || type > MAX_AIS_PACKET_TYPE)
		return; // unsupported packet type
}